

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O3

ze_result_t
driver::zeCommandListUpdateMutableCommandsExp
          (ze_command_list_handle_t hCommandList,ze_mutable_commands_exp_desc_t *desc)

{
  ze_result_t zVar1;
  
  if (DAT_0010e420 != (code *)0x0) {
    zVar1 = (*DAT_0010e420)();
    return zVar1;
  }
  return ZE_RESULT_SUCCESS;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeCommandListUpdateMutableCommandsExp(
        ze_command_list_handle_t hCommandList,          ///< [in] handle of the command list
        const ze_mutable_commands_exp_desc_t* desc      ///< [in] pointer to mutable commands descriptor; multiple descriptors may
                                                        ///< be chained via `pNext` member
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnUpdateMutableCommandsExp = context.zeDdiTable.CommandListExp.pfnUpdateMutableCommandsExp;
        if( nullptr != pfnUpdateMutableCommandsExp )
        {
            result = pfnUpdateMutableCommandsExp( hCommandList, desc );
        }
        else
        {
            // generic implementation
        }

        return result;
    }